

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O3

void duckdb::ArrowVarcharToStringViewData::Append
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  vector<duckdb::ArrowBuffer,_true> *this;
  undefined4 uVar1;
  data_ptr_t pdVar2;
  uchar uVar3;
  reference pvVar4;
  reference buffer;
  reference pvVar5;
  uint val;
  data_ptr_t pdVar6;
  void *__src;
  long lVar7;
  ulong uVar8;
  long lVar9;
  idx_t iVar10;
  ulong uVar11;
  long lVar12;
  UnifiedVectorFormat format;
  undefined8 local_b8;
  void *pvStack_b0;
  data_ptr_t local_a8;
  long local_a0;
  data_ptr_t local_98;
  reference local_90;
  long local_88;
  reference local_80;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(input,input_size,&local_78);
  this = &append_data->arrow_buffers;
  pvVar4 = vector<duckdb::ArrowBuffer,_true>::operator[](this,1);
  buffer = vector<duckdb::ArrowBuffer,_true>::operator[](this,0);
  pvVar5 = vector<duckdb::ArrowBuffer,_true>::operator[](this,2);
  lVar7 = to - from;
  ResizeValidity(buffer,append_data->row_count + lVar7);
  local_98 = buffer->dataptr;
  iVar10 = lVar7 * 0x10 + pvVar4->count;
  local_a0 = lVar7;
  local_90 = pvVar5;
  ArrowBuffer::reserve(pvVar4,iVar10);
  pvVar4->count = iVar10;
  if (from < to) {
    local_88 = from * 4;
    lVar7 = 0;
    local_a8 = local_78.data;
    local_80 = pvVar4;
    do {
      pvVar4 = local_90;
      if ((local_78.sel)->sel_vector == (sel_t *)0x0) {
        uVar11 = from + lVar7;
      }
      else {
        uVar11 = (ulong)*(uint *)((long)(local_78.sel)->sel_vector + lVar7 * 4 + local_88);
      }
      uVar8 = append_data->row_count + lVar7;
      pdVar2 = local_80->dataptr;
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar11 >> 6]
           >> (uVar11 & 0x3f) & 1) != 0)) {
        lVar12 = uVar11 * 0x10;
        val = (uint)*(ulong *)(local_78.data + lVar12);
        if (val < 0xd) {
          pdVar6 = local_78.data + lVar12 + 4;
        }
        else {
          pdVar6 = *(data_ptr_t *)(local_78.data + lVar12 + 8);
        }
        uVar11 = *(ulong *)(local_78.data + lVar12) & 0xffffffff;
        if (uVar11 < 0xd) {
          local_b8 = CONCAT44(local_b8._4_4_,val);
          switchD_015de399::default((void *)((long)&local_b8 + 4),pdVar6,uVar11);
          if (val < 0xc) {
            uVar3 = NumericCastImpl<unsigned_char,_int,_false>::Convert(val);
            switchD_01043a80::default
                      ((void *)((long)&local_b8 + uVar11 + 4),0,(ulong)(byte)(0xc - uVar3));
          }
          *(ulong *)(pdVar2 + uVar8 * 0x10) = local_b8;
          *(void **)((long)(pdVar2 + uVar8 * 0x10) + 8) = pvStack_b0;
          local_78.data = local_a8;
        }
        else {
          iVar10 = append_data->offset;
          uVar1 = *(undefined4 *)pdVar6;
          lVar9 = uVar8 * 0x10;
          *(uint *)(pdVar2 + lVar9) = val;
          *(undefined4 *)(pdVar2 + lVar9 + 4) = uVar1;
          pdVar6 = pdVar2 + lVar9 + 8;
          pdVar6[0] = '\0';
          pdVar6[1] = '\0';
          pdVar6[2] = '\0';
          pdVar6[3] = '\0';
          *(int *)(pdVar2 + lVar9 + 0xc) = (int)iVar10;
          iVar10 = uVar11 + append_data->offset;
          ArrowBuffer::reserve(local_90,iVar10);
          local_78.data = local_a8;
          pvVar4->count = iVar10;
          local_b8 = *(ulong *)(local_a8 + lVar12);
          pvStack_b0 = *(void **)((long)(local_a8 + lVar12) + 8);
          __src = pvStack_b0;
          if ((uint)local_b8 < 0xd) {
            __src = (void *)((long)&local_b8 + 4);
          }
          switchD_015de399::default
                    (pvVar4->dataptr + append_data->offset,__src,local_b8 & 0xffffffff);
          append_data->offset = iVar10;
        }
      }
      else {
        local_98[uVar8 >> 3] = local_98[uVar8 >> 3] & ~(byte)(1L << ((byte)uVar8 & 7));
        append_data->null_count = append_data->null_count + 1;
        pdVar2 = pdVar2 + uVar8 * 0x10;
        pdVar2[0] = '\0';
        pdVar2[1] = '\0';
        pdVar2[2] = '\0';
        pdVar2[3] = '\0';
        pdVar2[4] = '\0';
        pdVar2[5] = '\0';
        pdVar2[6] = '\0';
        pdVar2[7] = '\0';
        pdVar2[8] = '\0';
        pdVar2[9] = '\0';
        pdVar2[10] = '\0';
        pdVar2[0xb] = '\0';
        pdVar2[0xc] = '\0';
        pdVar2[0xd] = '\0';
        pdVar2[0xe] = '\0';
        pdVar2[0xf] = '\0';
      }
      lVar7 = lVar7 + 1;
    } while (to - from != lVar7);
  }
  append_data->row_count = append_data->row_count + local_a0;
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void Append(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		idx_t size = to - from;
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);
		auto &main_buffer = append_data.GetMainBuffer();
		auto &validity_buffer = append_data.GetValidityBuffer();
		auto &aux_buffer = append_data.GetAuxBuffer();
		// resize the validity mask and set up the validity buffer for iteration
		ResizeValidity(validity_buffer, append_data.row_count + size);
		auto validity_data = (uint8_t *)validity_buffer.data();

		main_buffer.resize(main_buffer.size() + sizeof(arrow_string_view_t) * (size));
		// resize the offset buffer - the offset buffer holds the offsets into the child array
		auto data = UnifiedVectorFormat::GetData<string_t>(format);
		for (idx_t i = from; i < to; i++) {
			auto result_idx = append_data.row_count + i - from;
			auto arrow_data = main_buffer.GetData<arrow_string_view_t>();
			auto source_idx = format.sel->get_index(i);
			if (!format.validity.RowIsValid(source_idx)) {
				// Null value
				uint8_t current_bit;
				idx_t current_byte;
				GetBitPosition(result_idx, current_byte, current_bit);
				SetNull(append_data, validity_data, current_byte, current_bit);
				// We have to set these bytes to 0, for some reason
				arrow_data[result_idx] = arrow_string_view_t(0, "");
				continue;
			}
			// These two are now the same buffer
			idx_t string_length = ArrowVarcharConverter::GetLength(data[source_idx]);
			auto string_data = data[source_idx].GetData();
			if (string_length <= ArrowStringViewConstants::MAX_INLINED_BYTES) {
				//	This string is inlined
				//  | Bytes 0-3  | Bytes 4-15                            |
				//  |------------|---------------------------------------|
				//  | length     | data (padded with 0)                  |
				arrow_data[result_idx] = arrow_string_view_t(UnsafeNumericCast<int32_t>(string_length), string_data);
			} else {
				// This string is not inlined, we have to check a different buffer and offsets
				//  | Bytes 0-3  | Bytes 4-7  | Bytes 8-11 | Bytes 12-15 |
				//  |------------|------------|------------|-------------|
				//  | length     | prefix     | buf. index | offset      |
				arrow_data[result_idx] = arrow_string_view_t(UnsafeNumericCast<int32_t>(string_length), string_data, 0,
				                                             UnsafeNumericCast<int32_t>(append_data.offset));
				auto current_offset = append_data.offset + string_length;
				aux_buffer.resize(current_offset);
				ArrowVarcharConverter::WriteData(aux_buffer.data() + append_data.offset, data[source_idx]);
				append_data.offset = current_offset;
			}
		}
		append_data.row_count += size;
	}